

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxVectorBuiltin::Emit(FxVectorBuiltin *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  PType *pPVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  ExpEmit EVar7;
  int iVar8;
  
  pPVar3 = (this->super_FxExpression).ValueType;
  bVar1 = pPVar3->RegType;
  bVar2 = pPVar3->RegCount;
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
  uVar5 = (*this->Self->_vptr_FxExpression[9])(this->Self,build);
  if ((this->Function).Index == 0x279) {
    iVar8 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbd;
    }
    VMFunctionBuilder::Emit(build,iVar8,uVar4 & 0xffff,(VM_SHALF)uVar5);
  }
  else {
    uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
    iVar8 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbd;
    }
    uVar6 = uVar6 & 0xffff;
    VMFunctionBuilder::Emit(build,iVar8,uVar6,(VM_SHALF)uVar5);
    iVar8 = 199;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbb;
    }
    VMFunctionBuilder::Emit(build,iVar8,uVar4 & 0xffff,uVar5 & 0xffff,uVar6);
    VMFunctionBuilder::RegAvailability::Return(build->Registers + 1,uVar6,1);
  }
  if ((CONCAT44(extraout_var,uVar5) & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar5) >> 0x10) & 3),uVar5 & 0xffff,
               uVar5 >> 0x18);
  }
  EVar7._0_4_ = uVar4 & 0xffff | (uint)bVar1 << 0x10 | (uint)bVar2 << 0x18;
  EVar7.Konst = false;
  EVar7.Fixed = false;
  EVar7.Final = false;
  EVar7.Target = false;
  return EVar7;
}

Assistant:

ExpEmit FxVectorBuiltin::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op = Self->Emit(build);
	if (Function == NAME_Length)
	{
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, to.RegNum, op.RegNum);
	}
	else
	{
		ExpEmit len(build, REGT_FLOAT);
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, len.RegNum, op.RegNum);
		build->Emit(Self->ValueType == TypeVector2 ? OP_DIVVF2_RR : OP_DIVVF3_RR, to.RegNum, op.RegNum, len.RegNum);
		len.Free(build);
	}
	op.Free(build);
	return to;
}